

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::shiftCost(HEkkDual *this,HighsInt iCol,double amount)

{
  undefined4 uVar1;
  undefined4 uVar2;
  HEkk *pHVar3;
  HighsSimplexAnalysis *pHVar4;
  double dVar5;
  double dVar6;
  
  pHVar3 = this->ekk_instance_;
  (pHVar3->info_).costs_shifted = true;
  if ((amount != 0.0) || (NAN(amount))) {
    (pHVar3->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iCol] = amount;
    dVar5 = ABS(amount);
    pHVar4 = this->analysis;
    uVar1 = pHVar4->net_num_single_cost_shift;
    uVar2 = pHVar4->num_single_cost_shift;
    pHVar4->net_num_single_cost_shift = uVar1 + 1;
    pHVar4->num_single_cost_shift = uVar2 + 1;
    pHVar4->sum_single_cost_shift = pHVar4->sum_single_cost_shift + dVar5;
    dVar6 = pHVar4->max_single_cost_shift;
    if (pHVar4->max_single_cost_shift <= dVar5) {
      dVar6 = dVar5;
    }
    pHVar4->max_single_cost_shift = dVar6;
  }
  return;
}

Assistant:

void HEkkDual::shiftCost(const HighsInt iCol, const double amount) {
  HighsSimplexInfo& info = ekk_instance_.info_;
  info.costs_shifted = true;
  assert(info.workShift_[iCol] == 0);
  if (!amount) return;
  double use_amount = amount;
  info.workShift_[iCol] = use_amount;
  // Analysis
  const double shift = fabs(use_amount);
  analysis->net_num_single_cost_shift++;
  analysis->num_single_cost_shift++;
  analysis->sum_single_cost_shift += shift;
  analysis->max_single_cost_shift = max(shift, analysis->max_single_cost_shift);
}